

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CheckerDataDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerDataDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::DataDeclarationSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataDeclarationSyntax *args_2)

{
  Token rand;
  CheckerDataDeclarationSyntax *this_00;
  
  this_00 = (CheckerDataDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CheckerDataDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (CheckerDataDeclarationSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  rand.kind = args_1->kind;
  rand._2_1_ = args_1->field_0x2;
  rand.numFlags.raw = (args_1->numFlags).raw;
  rand.rawLen = args_1->rawLen;
  rand.info = args_1->info;
  slang::syntax::CheckerDataDeclarationSyntax::CheckerDataDeclarationSyntax
            (this_00,args,rand,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }